

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall
pbrt::StatsAccumulator::AccumulatePixelStats(StatsAccumulator *this,PixelStatsAccumulator *accum)

{
  Image *pIVar1;
  pointer pbVar2;
  pointer pIVar3;
  int iVar4;
  Allocator AVar5;
  PixelStats *pPVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  Image *pIVar11;
  long lVar12;
  ulong uVar13;
  Stats *pSVar14;
  long *plVar15;
  Point2i PVar16;
  Float FVar17;
  Float FVar18;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  Point2i vb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  long *local_108 [2];
  long local_f8 [2];
  undefined1 **local_e8;
  ColorEncodingHandle local_e0;
  ColorEncodingHandle local_d8;
  Point2i va;
  int local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_a0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_98;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_78;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_58;
  ColorEncodingHandle local_38;
  
  pSVar14 = this->stats;
  iVar4 = DAT_02d4dc7c - DAT_02d4dc74;
  iVar9 = DAT_02d4dc78 - imageBounds;
  TVar7 = (pSVar14->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>;
  if (TVar7 == (Tuple2<pbrt::Point2,_int>)0x0) {
    vb.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"ms","");
    PVar16.super_Tuple2<pbrt::Point2,_int>.y = iVar4;
    PVar16.super_Tuple2<pbrt::Point2,_int>.x = iVar9;
    local_38.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    AVar5.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 1;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
    Image::Image((Image *)&va,Float,PVar16,channels,&local_38,AVar5);
    pSVar14 = this->stats;
    (pSVar14->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.y = local_c8;
    (pSVar14->pixelTime).format = va.super_Tuple2<pbrt::Point2,_int>.x;
    (pSVar14->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.x =
         va.super_Tuple2<pbrt::Point2,_int>.y;
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(pSVar14->pixelTime).channelNames,&local_c0);
    (pSVar14->pixelTime).encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = local_a0.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&(pSVar14->pixelTime).p8,&local_98);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&(pSVar14->pixelTime).p16,&local_78);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(pSVar14->pixelTime).p32,&local_58);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_58);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_78);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              (&local_98);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    if (vb.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)&local_138) {
      operator_delete((void *)vb.super_Tuple2<pbrt::Point2,_int>,local_138._M_allocated_capacity + 1
                     );
    }
    pSVar14 = this->stats;
    TVar7 = (pSVar14->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>;
  }
  else {
    vb.super_Tuple2<pbrt::Point2,_int>.y = iVar4;
    vb.super_Tuple2<pbrt::Point2,_int>.x = iVar9;
    if ((iVar9 != TVar7.x) || (iVar4 != TVar7.y)) {
      va.super_Tuple2<pbrt::Point2,_int> = TVar7;
      LogFatal<char_const(&)[30],char_const(&)[4],char_const(&)[30],pbrt::Point2<int>&,char_const(&)[4],pbrt::Point2<int>&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
                 ,0x105,"Check failed: %s == %s with %s = %s, %s = %s",
                 (char (*) [30])"stats->pixelTime.Resolution()",(char (*) [4])0x3c8677,
                 (char (*) [30])"stats->pixelTime.Resolution()",&va,(char (*) [4])0x3c8677,&vb);
    }
  }
  pPVar6 = accum->stats;
  vb.super_Tuple2<pbrt::Point2,_int> = (pPVar6->time).resolution.super_Tuple2<pbrt::Point2,_int>;
  va.super_Tuple2<pbrt::Point2,_int> = TVar7;
  if ((TVar7.x == vb.super_Tuple2<pbrt::Point2,_int>.x) &&
     (TVar7.y == vb.super_Tuple2<pbrt::Point2,_int>.y)) {
    if (TVar7.y != 0 && -1 < (long)TVar7) {
      lVar8 = 0;
      lVar12 = 0;
      do {
        if (0 < TVar7.x) {
          lVar10 = 0;
          do {
            PVar16.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar8 + lVar10);
            FVar17 = Image::GetChannel(&pSVar14->pixelTime,PVar16,0,(WrapMode2D)0x200000002);
            FVar18 = Image::GetChannel(&accum->stats->time,PVar16,0,(WrapMode2D)0x200000002);
            Image::SetChannel(&pSVar14->pixelTime,PVar16,0,FVar18 + FVar17);
            pSVar14 = this->stats;
            lVar10 = lVar10 + 1;
            TVar7 = (pSVar14->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>;
          } while (lVar10 < TVar7.x);
        }
        lVar8 = lVar8 + 0x100000000;
        lVar12 = lVar12 + 1;
      } while (lVar12 < (long)TVar7 >> 0x20);
      pPVar6 = accum->stats;
    }
    uVar13 = (long)(pPVar6->counterImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pPVar6->counterImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if ((ulong)((long)(pSVar14->pixelCounterImages).
                      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pSVar14->pixelCounterImages).
                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                     super__Vector_impl_data._M_start) < uVar13) {
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
                (&pSVar14->pixelCounterImages,((long)uVar13 >> 3) * -0x79435e50d79435e5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&this->stats->pixelCounterNames,
               (long)(accum->stats->counterNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(accum->stats->counterNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      pSVar14 = this->stats;
      pPVar6 = accum->stats;
    }
    uVar13 = (long)(pPVar6->ratioImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pPVar6->ratioImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if ((ulong)((long)(pSVar14->pixelRatioImages).
                      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pSVar14->pixelRatioImages).
                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                     super__Vector_impl_data._M_start) < uVar13) {
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
                (&pSVar14->pixelRatioImages,((long)uVar13 >> 3) * -0x79435e50d79435e5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&this->stats->pixelRatioNames,
               (long)(accum->stats->ratioNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(accum->stats->ratioNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      pPVar6 = accum->stats;
    }
    if ((pPVar6->counterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (pPVar6->counterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        pbVar2 = (this->stats->pixelCounterNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar2[uVar13]._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)(pbVar2 + uVar13));
          pPVar6 = accum->stats;
        }
        pIVar3 = (pPVar6->counterImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        TVar7 = pIVar3[uVar13].resolution.super_Tuple2<pbrt::Point2,_int>;
        if (TVar7 != (Tuple2<pbrt::Point2,_int>)0x0) {
          pIVar11 = pIVar3 + uVar13;
          pIVar3 = (this->stats->pixelCounterImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pIVar1 = pIVar3 + uVar13;
          if (pIVar3[uVar13].resolution.super_Tuple2<pbrt::Point2,_int> ==
              (Tuple2<pbrt::Point2,_int>)0x0) {
            vb.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&local_138;
            std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"count","");
            local_d8.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     )0;
            AVar5.memoryResource = pstd::pmr::new_delete_resource();
            channels_00.n = 1;
            channels_00.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
            Image::Image((Image *)&va,Float,(Point2i)TVar7,channels_00,&local_d8,AVar5);
            (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_c8;
            pIVar1->format = va.super_Tuple2<pbrt::Point2,_int>.x;
            (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.x =
                 va.super_Tuple2<pbrt::Point2,_int>.y;
            pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&pIVar1->channelNames,&local_c0);
            (pIVar1->encoding).
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits = local_a0.bits;
            pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                      (&pIVar1->p8,&local_98);
            pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                      (&pIVar1->p16,&local_78);
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                      (&pIVar1->p32,&local_58);
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_58);
            pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                      (&local_78);
            pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                      (&local_98);
            pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_c0);
            if (vb.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)&local_138) {
              operator_delete((void *)vb.super_Tuple2<pbrt::Point2,_int>,
                              local_138._M_allocated_capacity + 1);
            }
            TVar7 = (pIVar11->resolution).super_Tuple2<pbrt::Point2,_int>;
          }
          if (0 < TVar7.y) {
            lVar12 = 0;
            lVar8 = 0;
            do {
              if (0 < TVar7.x) {
                lVar10 = 0;
                do {
                  PVar16.super_Tuple2<pbrt::Point2,_int> =
                       (Tuple2<pbrt::Point2,_int>)(lVar12 + lVar10);
                  FVar17 = Image::GetChannel(pIVar1,PVar16,0,(WrapMode2D)0x200000002);
                  FVar18 = Image::GetChannel(pIVar11,PVar16,0,(WrapMode2D)0x200000002);
                  Image::SetChannel(pIVar1,PVar16,0,FVar18 + FVar17);
                  TVar7 = (pIVar11->resolution).super_Tuple2<pbrt::Point2,_int>;
                  lVar10 = lVar10 + 1;
                } while (lVar10 < TVar7.x);
              }
              lVar12 = lVar12 + 0x100000000;
              lVar8 = lVar8 + 1;
            } while (lVar8 < (long)TVar7 >> 0x20);
          }
        }
        pPVar6 = accum->stats;
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(((long)(pPVar6->counterImages).
                                       super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pPVar6->counterImages).
                                       super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x79435e50d79435e5));
    }
    if ((pPVar6->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pPVar6->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_e8 = local_128;
      uVar13 = 0;
      do {
        pbVar2 = (this->stats->pixelRatioNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar2[uVar13]._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)(pbVar2 + uVar13));
          pPVar6 = accum->stats;
        }
        pIVar3 = (pPVar6->ratioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        TVar7 = pIVar3[uVar13].resolution.super_Tuple2<pbrt::Point2,_int>;
        if (TVar7 != (Tuple2<pbrt::Point2,_int>)0x0) {
          pIVar11 = pIVar3 + uVar13;
          pIVar3 = (this->stats->pixelRatioImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pIVar1 = pIVar3 + uVar13;
          if (pIVar3[uVar13].resolution.super_Tuple2<pbrt::Point2,_int> ==
              (Tuple2<pbrt::Point2,_int>)0x0) {
            vb.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&local_138;
            std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"numerator","");
            local_128[0] = local_118;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"denominator","");
            local_108[0] = local_f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"ratio","");
            local_e0.
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     )0;
            AVar5.memoryResource = pstd::pmr::new_delete_resource();
            channels_01.n = 3;
            channels_01.ptr =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
            Image::Image((Image *)&va,Float,(Point2i)TVar7,channels_01,&local_e0,AVar5);
            (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_c8;
            pIVar1->format = va.super_Tuple2<pbrt::Point2,_int>.x;
            (pIVar1->resolution).super_Tuple2<pbrt::Point2,_int>.x =
                 va.super_Tuple2<pbrt::Point2,_int>.y;
            pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&pIVar1->channelNames,&local_c0);
            (pIVar1->encoding).
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits = local_a0.bits;
            pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                      (&pIVar1->p8,&local_98);
            pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                      (&pIVar1->p16,&local_78);
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                      (&pIVar1->p32,&local_58);
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_58);
            pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                      (&local_78);
            pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                      (&local_98);
            pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_c0);
            lVar8 = -0x60;
            plVar15 = local_f8;
            do {
              if (plVar15 != (long *)plVar15[-2]) {
                operator_delete((long *)plVar15[-2],*plVar15 + 1);
              }
              plVar15 = plVar15 + -4;
              lVar8 = lVar8 + 0x20;
            } while (lVar8 != 0);
            TVar7 = (pIVar11->resolution).super_Tuple2<pbrt::Point2,_int>;
          }
          if (0 < TVar7.y) {
            lVar12 = 0;
            lVar8 = 0;
            do {
              if (0 < TVar7.x) {
                lVar10 = 0;
                do {
                  PVar16.super_Tuple2<pbrt::Point2,_int> =
                       (Tuple2<pbrt::Point2,_int>)(lVar12 + lVar10);
                  FVar17 = Image::GetChannel(pIVar1,PVar16,0,(WrapMode2D)0x200000002);
                  FVar18 = Image::GetChannel(pIVar11,PVar16,0,(WrapMode2D)0x200000002);
                  Image::SetChannel(pIVar1,PVar16,0,FVar18 + FVar17);
                  FVar17 = Image::GetChannel(pIVar1,PVar16,1,(WrapMode2D)0x200000002);
                  FVar18 = Image::GetChannel(pIVar11,PVar16,1,(WrapMode2D)0x200000002);
                  Image::SetChannel(pIVar1,PVar16,1,FVar18 + FVar17);
                  FVar17 = Image::GetChannel(pIVar1,PVar16,0,(WrapMode2D)0x200000002);
                  FVar18 = 0.0;
                  if ((FVar17 != 0.0) || (NAN(FVar17))) {
                    FVar18 = Image::GetChannel(pIVar1,PVar16,0,(WrapMode2D)0x200000002);
                    FVar17 = Image::GetChannel(pIVar1,PVar16,1,(WrapMode2D)0x200000002);
                    FVar18 = FVar18 / FVar17;
                  }
                  Image::SetChannel(pIVar1,PVar16,2,FVar18);
                  TVar7 = (pIVar11->resolution).super_Tuple2<pbrt::Point2,_int>;
                  lVar10 = lVar10 + 1;
                } while (lVar10 < TVar7.x);
              }
              lVar12 = lVar12 + 0x100000000;
              lVar8 = lVar8 + 1;
            } while (lVar8 < (long)TVar7 >> 0x20);
          }
        }
        pPVar6 = accum->stats;
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(((long)(pPVar6->ratioImages).
                                       super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pPVar6->ratioImages).
                                       super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x79435e50d79435e5));
    }
    return;
  }
  LogFatal<char_const(&)[30],char_const(&)[31],char_const(&)[30],pbrt::Point2<int>&,char_const(&)[31],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
             ,0x106,"Check failed: %s == %s with %s = %s, %s = %s",
             (char (*) [30])"stats->pixelTime.Resolution()",
             (char (*) [31])"accum.stats->time.Resolution()",
             (char (*) [30])"stats->pixelTime.Resolution()",&va,
             (char (*) [31])"accum.stats->time.Resolution()",&vb);
}

Assistant:

void StatsAccumulator::AccumulatePixelStats(const PixelStatsAccumulator &accum) {
    Point2i res = Point2i(imageBounds.Diagonal());
    if (stats->pixelTime.Resolution() == Point2i(0, 0))
        stats->pixelTime = Image(PixelFormat::Float, res, {"ms"});
    else
        CHECK_EQ(stats->pixelTime.Resolution(), res);
    CHECK_EQ(stats->pixelTime.Resolution(), accum.stats->time.Resolution());

    for (int y = 0; y < stats->pixelTime.Resolution().y; ++y)
        for (int x = 0; x < stats->pixelTime.Resolution().x; ++x)
            stats->pixelTime.SetChannel({x, y}, 0,
                                        (stats->pixelTime.GetChannel({x, y}, 0) +
                                         accum.stats->time.GetChannel({x, y}, 0)));

    if (stats->pixelCounterImages.size() < accum.stats->counterImages.size()) {
        stats->pixelCounterImages.resize(accum.stats->counterImages.size());
        stats->pixelCounterNames.resize(accum.stats->counterNames.size());
    }
    if (stats->pixelRatioImages.size() < accum.stats->ratioImages.size()) {
        stats->pixelRatioImages.resize(accum.stats->ratioImages.size());
        stats->pixelRatioNames.resize(accum.stats->ratioNames.size());
    }

    for (size_t i = 0; i < accum.stats->counterImages.size(); ++i) {
        if (stats->pixelCounterNames[i].empty())
            stats->pixelCounterNames[i] = accum.stats->counterNames[i];

        const Image &threadImage = accum.stats->counterImages[i];
        if (threadImage.Resolution() == Point2i(0, 0))
            continue;
        Image &accumImage = stats->pixelCounterImages[i];
        if (accumImage.Resolution() == Point2i(0, 0))
            accumImage = Image(PixelFormat::Float, threadImage.Resolution(), {"count"});
        for (int y = 0; y < threadImage.Resolution().y; ++y)
            for (int x = 0; x < threadImage.Resolution().x; ++x)
                accumImage.SetChannel({x, y}, 0,
                                      (accumImage.GetChannel({x, y}, 0) +
                                       threadImage.GetChannel({x, y}, 0)));
    }
    for (size_t i = 0; i < accum.stats->ratioImages.size(); ++i) {
        if (stats->pixelRatioNames[i].empty())
            stats->pixelRatioNames[i] = accum.stats->ratioNames[i];

        const Image &threadImage = accum.stats->ratioImages[i];
        if (threadImage.Resolution() == Point2i(0, 0))
            continue;
        Image &accumImage = stats->pixelRatioImages[i];
        if (accumImage.Resolution() == Point2i(0, 0))
            accumImage = Image(PixelFormat::Float, threadImage.Resolution(),
                               {"numerator", "denominator", "ratio"});
        for (int y = 0; y < threadImage.Resolution().y; ++y)
            for (int x = 0; x < threadImage.Resolution().x; ++x) {
                accumImage.SetChannel({x, y}, 0,
                                      (accumImage.GetChannel({x, y}, 0) +
                                       threadImage.GetChannel({x, y}, 0)));
                accumImage.SetChannel({x, y}, 1,
                                      (accumImage.GetChannel({x, y}, 1) +
                                       threadImage.GetChannel({x, y}, 1)));
                if (accumImage.GetChannel({x, y}, 0) == 0)
                    accumImage.SetChannel({x, y}, 2, 0.f);
                else
                    accumImage.SetChannel({x, y}, 2,
                                          (accumImage.GetChannel({x, y}, 0) /
                                           accumImage.GetChannel({x, y}, 1)));
            }
    }
}